

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void __thiscall
CPU::WDC65816::ProcessorStorageConstructor::set_exception_generator
          (ProcessorStorageConstructor *this,Generator generator,Generator reset_generator)

{
  uint16_t uVar1;
  ProcessorStorage *pPVar2;
  iterator iVar3;
  
  iVar3 = install(this,generator,Read);
  uVar1 = *(uint16_t *)&iVar3._M_node[1]._M_left;
  pPVar2 = this->storage_;
  pPVar2->instructions[0x100].program_offsets[1] = uVar1;
  pPVar2->instructions[0x100].program_offsets[0] = uVar1;
  pPVar2->instructions[0x100].operation = JMPind;
  iVar3 = install(this,reset_generator,Read);
  uVar1 = *(uint16_t *)&iVar3._M_node[1]._M_left;
  pPVar2 = this->storage_;
  pPVar2->instructions[0x101].program_offsets[1] = uVar1;
  pPVar2->instructions[0x101].program_offsets[0] = uVar1;
  pPVar2->instructions[0x101].operation = JMPind;
  return;
}

Assistant:

void set_exception_generator(Generator generator, Generator reset_generator) {
		const auto map_entry = install(generator);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].program_offsets[0] =
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].program_offsets[1] = uint16_t(map_entry->second.first);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].operation = JMPind;

		const auto reset_tail_entry = install(reset_generator);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].program_offsets[0] =
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].program_offsets[1] = uint16_t(reset_tail_entry->second.first);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].operation = JMPind;
	}